

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

void __thiscall miniros::observer::TargetBase::~TargetBase(TargetBase *this)

{
  void *in_RDI;
  TargetBase *unaff_retaddr;
  
  ~TargetBase(unaff_retaddr);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TargetBase::~TargetBase() {
    assert(m_list);
    if (m_list) {
        m_list->disconnectAll();
        bool detached = m_list->detachOwner(this);
        assert(detached);
        delete m_list;
    }
    m_list = nullptr;
}